

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O3

void __thiscall tonk::gateway::AsioHost::WorkerLoop(AsioHost *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  error_code ec;
  error_code local_1e8;
  char *local_1d8;
  long local_1d0;
  char local_1c8 [16];
  undefined1 local_1b8 [392];
  
  local_1e8._M_value = 0;
  local_1e8._M_cat = (error_category *)std::_V2::system_category();
  if (((this->Terminated)._M_base._M_i & 1U) == 0) {
    this_00 = (ostringstream *)(local_1b8 + 0x10);
    do {
      asio::detail::scheduler::run
                (((this->Context)._M_t.
                  super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                  .super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl)->impl_,&local_1e8)
      ;
      if (local_1e8._M_value != 0) {
        (**(code **)(*(long *)local_1e8._M_cat + 0x20))(&local_1d8);
        if (DAT_001e1cd0 < 4) {
          local_1b8._0_8_ = ModuleLogger;
          local_1b8._8_4_ = Warning;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,DAT_001e1d00,DAT_001e1d08);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Worker loop context error: ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_1d8,local_1d0)
          ;
          this_01 = logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1b8);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8);
        }
      }
    } while (((this->Terminated)._M_base._M_i & 1U) == 0);
  }
  return;
}

Assistant:

void AsioHost::WorkerLoop()
{
    asio::error_code ec;

    while (!Terminated)
    {
        Context->run(ec);

        if (ec) {
            ModuleLogger.Warning("Worker loop context error: ", ec.message());
        }
    }
}